

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

bool SetGenericProperty<std::__cxx11::string>
               (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *list,char *szName,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  uint32_t hash;
  undefined1 local_50 [40];
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    iVar2 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&list->_M_t,&hash);
    p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
      local_50._0_4_ = hash;
      std::__cxx11::string::string((string *)(local_50 + 8),(string *)value);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                  *)list,(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_50);
      std::__cxx11::string::~string((string *)(local_50 + 8));
    }
    else {
      std::__cxx11::string::_M_assign((string *)&iVar2._M_node[1]._M_parent);
    }
    return (_Rb_tree_header *)iVar2._M_node != p_Var1;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                ,0x39,
                "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = std::basic_string<char>]"
               );
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}